

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O1

value YAML::Utils::ComputeStringFormat
                (string *str,EMITTER_MANIP strFormat,value flowType,bool escapeNonAscii)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  RegEx *pRVar6;
  RegEx *pRVar7;
  undefined8 *puVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  RegEx local_f0;
  RegEx local_d0;
  RegEx local_b0;
  RegEx local_90;
  RegEx local_70;
  RegEx local_50;
  
  if (strFormat == Literal) {
    if (flowType == Flow) {
      return DoubleQuoted;
    }
    pcVar9 = (str->_M_dataplus)._M_p;
    uVar2 = str->_M_string_length;
    pcVar1 = pcVar9 + uVar2;
    pcVar10 = pcVar9;
    if (0 < (long)uVar2 >> 2) {
      pcVar10 = pcVar9 + (uVar2 & 0xfffffffffffffffc);
      lVar11 = ((long)uVar2 >> 2) + 1;
      pcVar9 = pcVar9 + 3;
      do {
        if (pcVar9[-3] < '\0' && escapeNonAscii) {
          pcVar9 = pcVar9 + -3;
          goto LAB_0071768f;
        }
        if (pcVar9[-2] < '\0' && escapeNonAscii) {
          pcVar9 = pcVar9 + -2;
          goto LAB_0071768f;
        }
        if (pcVar9[-1] < '\0' && escapeNonAscii) {
          pcVar9 = pcVar9 + -1;
          goto LAB_0071768f;
        }
        if (*pcVar9 < '\0' && escapeNonAscii) goto LAB_0071768f;
        lVar11 = lVar11 + -1;
        pcVar9 = pcVar9 + 4;
      } while (1 < lVar11);
    }
    lVar11 = (long)pcVar1 - (long)pcVar10;
    if (lVar11 != 1) {
      pcVar9 = pcVar10;
      if (lVar11 != 2) {
        pcVar9 = pcVar1;
        if ((lVar11 != 3) || (pcVar9 = pcVar10, *pcVar10 < '\0' && escapeNonAscii))
        goto LAB_0071768f;
        pcVar9 = pcVar10 + 1;
      }
      if (*pcVar9 < '\0' && escapeNonAscii) goto LAB_0071768f;
      pcVar10 = pcVar9 + 1;
    }
    pcVar9 = pcVar1;
    if (escapeNonAscii) {
      pcVar9 = pcVar10;
    }
    if (-1 < *pcVar10) {
      pcVar9 = pcVar1;
    }
LAB_0071768f:
    return pcVar9 == pcVar1 | DoubleQuoted;
  }
  if (strFormat != SingleQuoted) {
    if (strFormat != Auto) {
      return DoubleQuoted;
    }
    bVar3 = IsNullString(str);
    if (bVar3) {
      return DoubleQuoted;
    }
    if (flowType == Flow) {
      pRVar6 = Exp::PlainScalarInFlow();
    }
    else {
      pRVar6 = Exp::PlainScalar();
    }
    iVar5 = RegEx::Match(pRVar6,str);
    if (iVar5 < 0) {
      return DoubleQuoted;
    }
    if ((str->_M_string_length != 0) && ((str->_M_dataplus)._M_p[str->_M_string_length - 1] == ' '))
    {
      return DoubleQuoted;
    }
    if (((anonymous_namespace)::
         IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::disallowed_flow
         == '\0') &&
       (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                                     ::disallowed_flow), iVar5 != 0)) {
      pRVar6 = Exp::EndScalarInFlow();
      pRVar7 = Exp::BlankOrBreak();
      Exp::Comment();
      operator+(&local_b0,pRVar7,&local_d0);
      operator|(&local_90,pRVar6,&local_b0);
      pRVar6 = Exp::NotPrintable();
      operator|(&local_70,&local_90,pRVar6);
      pRVar6 = Exp::Utf8_ByteOrderMark();
      operator|(&local_50,&local_70,pRVar6);
      pRVar6 = Exp::Break();
      operator|(&local_f0,&local_50,pRVar6);
      pRVar6 = Exp::Tab();
      operator|((RegEx *)(anonymous_namespace)::
                         IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                         ::disallowed_flow,&local_f0,pRVar6);
      __cxa_atexit(RegEx::~RegEx,
                   (anonymous_namespace)::
                   IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                   disallowed_flow,&__dso_handle);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_f0.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_50.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_70.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_90.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_b0.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_d0.m_params);
      (anonymous_namespace)::
      IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::disallowed_flow =
           (anonymous_namespace)::
           IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
           disallowed_flow;
      __cxa_guard_release(&(anonymous_namespace)::
                           IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                           ::disallowed_flow);
    }
    if (((anonymous_namespace)::
         IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
         disallowed_block == '\0') &&
       (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                                     ::disallowed_block), iVar5 != 0)) {
      pRVar6 = Exp::EndScalar();
      pRVar7 = Exp::BlankOrBreak();
      Exp::Comment();
      operator+(&local_b0,pRVar7,&local_d0);
      operator|(&local_90,pRVar6,&local_b0);
      pRVar6 = Exp::NotPrintable();
      operator|(&local_70,&local_90,pRVar6);
      pRVar6 = Exp::Utf8_ByteOrderMark();
      operator|(&local_50,&local_70,pRVar6);
      pRVar6 = Exp::Break();
      operator|(&local_f0,&local_50,pRVar6);
      pRVar6 = Exp::Tab();
      operator|((RegEx *)(anonymous_namespace)::
                         IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                         ::disallowed_block,&local_f0,pRVar6);
      __cxa_atexit(RegEx::~RegEx,
                   (anonymous_namespace)::
                   IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                   disallowed_block,&__dso_handle);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_f0.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_50.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_70.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_90.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_b0.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_d0.m_params);
      (anonymous_namespace)::
      IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::disallowed_block =
           (anonymous_namespace)::
           IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
           disallowed_block;
      __cxa_guard_release(&(anonymous_namespace)::
                           IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                           ::disallowed_block);
    }
    puVar8 = &(anonymous_namespace)::
              IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
              disallowed_block;
    if (flowType == Flow) {
      puVar8 = &(anonymous_namespace)::
                IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                disallowed_flow;
    }
    pRVar6 = (RegEx *)*puVar8;
    local_f0._0_8_ = (str->_M_dataplus)._M_p;
    local_f0.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)str->_M_string_length;
    local_f0.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar3 = local_f0.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0;
    if ((!bVar3) &&
       (bVar4 = RegEx::Matches<YAML::StringCharSource>(pRVar6,(StringCharSource *)&local_f0), !bVar4
       )) {
      while ((!escapeNonAscii ||
             (-1 < *(char *)(local_f0._0_8_ +
                            (long)local_f0.m_params.
                                  super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                                  _M_impl.super__Vector_impl_data._M_finish)))) {
        local_f0.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)&(local_f0.m_params.
                               super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
                               .super__Vector_impl_data._M_finish)->m_op + 1);
        bVar3 = local_f0.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                _M_impl.super__Vector_impl_data._M_start <=
                local_f0.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        if ((bVar3) ||
           (bVar4 = RegEx::Matches<YAML::StringCharSource>(pRVar6,(StringCharSource *)&local_f0),
           bVar4)) break;
      }
    }
    return ((byte)~bVar3 & 1) * 2;
  }
  pcVar9 = (str->_M_dataplus)._M_p;
  uVar2 = str->_M_string_length;
  pcVar1 = pcVar9 + uVar2;
  pcVar10 = pcVar9;
  if (0 < (long)uVar2 >> 2) {
    pcVar10 = pcVar9 + (uVar2 & 0xfffffffffffffffc);
    lVar11 = ((long)uVar2 >> 2) + 1;
    pcVar9 = pcVar9 + 3;
    do {
      if ((pcVar9[-3] == '\n') || (pcVar9[-3] < '\0' && escapeNonAscii)) {
        pcVar9 = pcVar9 + -3;
        goto LAB_0071765c;
      }
      if ((pcVar9[-2] == '\n') || (pcVar9[-2] < '\0' && escapeNonAscii)) {
        pcVar9 = pcVar9 + -2;
        goto LAB_0071765c;
      }
      if ((pcVar9[-1] == '\n') || (pcVar9[-1] < '\0' && escapeNonAscii)) {
        pcVar9 = pcVar9 + -1;
        goto LAB_0071765c;
      }
      if ((*pcVar9 == '\n') || (*pcVar9 < '\0' && escapeNonAscii)) goto LAB_0071765c;
      lVar11 = lVar11 + -1;
      pcVar9 = pcVar9 + 4;
    } while (1 < lVar11);
  }
  lVar11 = (long)pcVar1 - (long)pcVar10;
  if (lVar11 != 1) {
    pcVar9 = pcVar10;
    if (lVar11 != 2) {
      pcVar9 = pcVar1;
      if ((lVar11 != 3) || (pcVar9 = pcVar10, *pcVar10 == '\n' || *pcVar10 < '\0' && escapeNonAscii)
         ) goto LAB_0071765c;
      pcVar9 = pcVar10 + 1;
    }
    if (*pcVar9 == '\n' || *pcVar9 < '\0' && escapeNonAscii) goto LAB_0071765c;
    pcVar10 = pcVar9 + 1;
  }
  pcVar9 = pcVar1;
  if (escapeNonAscii) {
    pcVar9 = pcVar10;
  }
  if (-1 < *pcVar10) {
    pcVar9 = pcVar1;
  }
  if (*pcVar10 == '\n') {
    pcVar9 = pcVar10;
  }
LAB_0071765c:
  return (pcVar9 != pcVar1) + SingleQuoted;
}

Assistant:

StringFormat::value ComputeStringFormat(const std::string& str,
                                        EMITTER_MANIP strFormat,
                                        FlowType::value flowType,
                                        bool escapeNonAscii) {
  switch (strFormat) {
    case Auto:
      if (IsValidPlainScalar(str, flowType, escapeNonAscii)) {
        return StringFormat::Plain;
      }
      return StringFormat::DoubleQuoted;
    case SingleQuoted:
      if (IsValidSingleQuotedScalar(str, escapeNonAscii)) {
        return StringFormat::SingleQuoted;
      }
      return StringFormat::DoubleQuoted;
    case DoubleQuoted:
      return StringFormat::DoubleQuoted;
    case Literal:
      if (IsValidLiteralScalar(str, flowType, escapeNonAscii)) {
        return StringFormat::Literal;
      }
      return StringFormat::DoubleQuoted;
    default:
      break;
  }

  return StringFormat::DoubleQuoted;
}